

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

TString * luaS_createlngstrobj(lua_State *L,size_t l)

{
  uint uVar1;
  TString *pTVar2;
  
  uVar1 = L->l_G->seed;
  pTVar2 = (TString *)luaC_newobj(L,0x14,l + 0x19);
  pTVar2->hash = uVar1;
  pTVar2->extra = '\0';
  pTVar2->contents[l] = '\0';
  (pTVar2->u).lnglen = l;
  pTVar2->shrlen = 0xff;
  return pTVar2;
}

Assistant:

TString *luaS_createlngstrobj (lua_State *L, size_t l) {
  TString *ts = createstrobj(L, l, LUA_VLNGSTR, G(L)->seed);
  ts->u.lnglen = l;
  ts->shrlen = 0xFF;  /* signals that it is a long string */
  return ts;
}